

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizerAndResolverTester.h
# Opt level: O3

void __thiscall
psy::C::TypeCanonicalizerAndResolverTester::TypeCanonicalizerAndResolverTester
          (TypeCanonicalizerAndResolverTester *this,TestSuite *suite)

{
  code **ppcVar1;
  long lVar2;
  initializer_list<std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>_>
  __l;
  allocator_type local_989;
  code *local_988 [2];
  code *local_978;
  code *local_970;
  char *local_968;
  code *local_960;
  undefined8 local_958;
  code *local_950;
  code *local_948;
  char *local_940;
  code *local_938;
  undefined8 local_930;
  code *local_928;
  code *local_920;
  char *local_918;
  code *local_910;
  undefined8 local_908;
  code *local_900;
  code *local_8f8;
  char *local_8f0;
  code *local_8e8;
  undefined8 local_8e0;
  code *local_8d8;
  code *local_8d0;
  char *local_8c8;
  code *local_8c0;
  undefined8 local_8b8;
  code *local_8b0;
  code *local_8a8;
  char *local_8a0;
  code *local_898;
  undefined8 local_890;
  code *local_888;
  code *local_880;
  char *local_878;
  code *local_870;
  undefined8 local_868;
  code *local_860;
  code *local_858;
  char *local_850;
  code *local_848;
  undefined8 local_840;
  code *local_838;
  code *local_830;
  char *local_828;
  code *local_820;
  undefined8 local_818;
  code *local_810;
  code *local_808;
  char *local_800;
  code *local_7f8;
  undefined8 local_7f0;
  code *local_7e8;
  code *local_7e0;
  char *local_7d8;
  code *local_7d0;
  undefined8 local_7c8;
  code *local_7c0;
  code *local_7b8;
  char *local_7b0;
  code *local_7a8;
  undefined8 local_7a0;
  code *local_798;
  code *local_790;
  char *local_788;
  code *local_780;
  undefined8 local_778;
  code *local_770;
  code *local_768;
  char *local_760;
  code *local_758;
  undefined8 local_750;
  code *local_748;
  code *local_740;
  char *local_738;
  code *local_730;
  undefined8 local_728;
  code *local_720;
  code *local_718;
  char *local_710;
  code *local_708;
  undefined8 local_700;
  code *local_6f8;
  code *local_6f0;
  char *local_6e8;
  code *local_6e0;
  undefined8 local_6d8;
  code *local_6d0;
  code *local_6c8;
  char *local_6c0;
  code *local_6b8;
  undefined8 local_6b0;
  code *local_6a8;
  code *local_6a0;
  char *local_698;
  code *local_690;
  undefined8 local_688;
  code *local_680;
  code *local_678;
  char *local_670;
  code *local_668;
  undefined8 local_660;
  code *local_658;
  code *local_650;
  char *local_648;
  code *local_640;
  undefined8 local_638;
  code *local_630;
  code *local_628;
  char *local_620;
  code *local_618;
  undefined8 local_610;
  code *local_608;
  code *local_600;
  char *local_5f8;
  code *local_5f0;
  undefined8 local_5e8;
  code *local_5e0;
  code *local_5d8;
  char *local_5d0;
  code *local_5c8;
  undefined8 local_5c0;
  code *local_5b8;
  code *local_5b0;
  char *local_5a8;
  code *local_5a0;
  undefined8 local_598;
  code *local_590;
  code *local_588;
  char *local_580;
  code *local_578;
  undefined8 local_570;
  code *local_568;
  code *local_560;
  char *local_558;
  code *local_550;
  undefined8 local_548;
  code *local_540;
  code *local_538;
  char *local_530;
  code *local_528;
  undefined8 local_520;
  code *local_518;
  code *local_510;
  char *local_508;
  code *local_500;
  undefined8 local_4f8;
  code *local_4f0;
  code *local_4e8;
  char *local_4e0;
  code *local_4d8;
  undefined8 local_4d0;
  code *local_4c8;
  code *local_4c0;
  char *local_4b8;
  code *local_4b0;
  undefined8 local_4a8;
  code *local_4a0;
  code *local_498;
  char *local_490;
  code *local_488;
  undefined8 local_480;
  code *local_478;
  code *local_470;
  char *local_468;
  code *local_460;
  undefined8 local_458;
  code *local_450;
  code *local_448;
  char *local_440;
  code *local_438;
  undefined8 local_430;
  code *local_428;
  code *local_420;
  char *local_418;
  code *local_410;
  undefined8 local_408;
  code *local_400;
  code *local_3f8;
  char *local_3f0;
  code *local_3e8;
  undefined8 local_3e0;
  code *local_3d8;
  code *local_3d0;
  char *local_3c8;
  code *local_3c0;
  undefined8 local_3b8;
  code *local_3b0;
  code *local_3a8;
  char *local_3a0;
  code *local_398;
  undefined8 local_390;
  code *local_388;
  code *local_380;
  char *local_378;
  code *local_370;
  undefined8 local_368;
  code *local_360;
  code *local_358;
  char *local_350;
  code *local_348;
  undefined8 local_340;
  code *local_338;
  code *local_330;
  char *local_328;
  code *local_320;
  undefined8 local_318;
  code *local_310;
  code *local_308;
  char *local_300;
  code *local_2f8;
  undefined8 local_2f0;
  code *local_2e8;
  code *local_2e0;
  char *local_2d8;
  code *local_2d0;
  undefined8 local_2c8;
  code *local_2c0;
  code *local_2b8;
  char *local_2b0;
  code *local_2a8;
  undefined8 local_2a0;
  code *local_298;
  code *local_290;
  char *local_288;
  code *local_280;
  undefined8 local_278;
  code *local_270;
  code *local_268;
  char *local_260;
  code *local_258;
  undefined8 local_250;
  code *local_248;
  code *local_240;
  char *local_238;
  code *local_230;
  undefined8 local_228;
  code *local_220;
  code *local_218;
  char *local_210;
  code *local_208;
  undefined8 local_200;
  code *local_1f8;
  code *local_1f0;
  char *local_1e8;
  code *local_1e0;
  undefined8 local_1d8;
  code *local_1d0;
  code *local_1c8;
  char *local_1c0;
  code *local_1b8;
  undefined8 local_1b0;
  code *local_1a8;
  code *local_1a0;
  char *local_198;
  code *local_190;
  undefined8 local_188;
  code *local_180;
  code *local_178;
  char *local_170;
  code *local_168;
  undefined8 local_160;
  code *local_158;
  code *local_150;
  char *local_148;
  code *local_140;
  undefined8 local_138;
  code *local_130;
  code *local_128;
  char *local_120;
  code *local_118;
  undefined8 local_110;
  code *local_108;
  code *local_100;
  char *local_f8;
  code *local_f0;
  undefined8 local_e8;
  code *local_e0;
  code *local_d8;
  char *local_d0;
  code *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  char *local_a8;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  code *local_88;
  char *local_80;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  code *local_60;
  char *local_58;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  char *local_30;
  
  (this->super_Tester).suite_ = suite;
  (this->super_Tester).cntPassed_ = 0;
  (this->super_Tester).cntFailed_ = 0;
  (this->super_Tester).curTestFunc_._M_dataplus._M_p =
       (pointer)&(this->super_Tester).curTestFunc_.field_2;
  (this->super_Tester).curTestFunc_._M_string_length = 0;
  (this->super_Tester).curTestFunc_.field_2._M_local_buf[0] = '\0';
  (this->super_Tester)._vptr_Tester =
       (_func_int **)&PTR__TypeCanonicalizerAndResolverTester_00522608;
  local_988[0] = case0000;
  local_988[1] = (code *)0x0;
  local_970 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_978 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_968 = "case0000";
  local_960 = case0001;
  local_958 = 0;
  local_948 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_950 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_940 = "case0001";
  local_938 = case0002;
  local_930 = 0;
  local_920 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_928 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_918 = "case0002";
  local_910 = case0003;
  local_908 = 0;
  local_8f8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_900 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_8f0 = "case0003";
  local_8e8 = case0004;
  local_8e0 = 0;
  local_8d0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_8d8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_8c8 = "case0004";
  local_8c0 = case0005;
  local_8b8 = 0;
  local_8a8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_8b0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_8a0 = "case0005";
  local_898 = case0006;
  local_890 = 0;
  local_880 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_888 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_878 = "case0006";
  local_870 = case0007;
  local_868 = 0;
  local_858 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_860 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_850 = "case0007";
  local_848 = case0008;
  local_840 = 0;
  local_830 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_838 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_828 = "case0008";
  local_820 = case0009;
  local_818 = 0;
  local_808 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_810 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_800 = "case0009";
  local_7f8 = case0010;
  local_7f0 = 0;
  local_7e0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_7e8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_7d8 = "case0010";
  local_7d0 = case0011;
  local_7c8 = 0;
  local_7b8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_7c0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_7b0 = "case0011";
  local_7a8 = case0012;
  local_7a0 = 0;
  local_790 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_798 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_788 = "case0012";
  local_780 = case0013;
  local_778 = 0;
  local_768 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_770 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_760 = "case0013";
  local_758 = case0014;
  local_750 = 0;
  local_740 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_748 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_738 = "case0014";
  local_730 = case0015;
  local_728 = 0;
  local_718 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_720 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_710 = "case0015";
  local_708 = case0016;
  local_700 = 0;
  local_6f0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_6f8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_6e8 = "case0016";
  local_6e0 = case0017;
  local_6d8 = 0;
  local_6c8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_6d0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_6c0 = "case0017";
  local_6b8 = case0018;
  local_6b0 = 0;
  local_6a0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_6a8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_698 = "case0018";
  local_690 = case0019;
  local_688 = 0;
  local_678 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_680 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_670 = "case0019";
  local_668 = case0020;
  local_660 = 0;
  local_650 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_658 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_648 = "case0020";
  local_640 = case0021;
  local_638 = 0;
  local_628 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_630 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_620 = "case0021";
  local_618 = case0022;
  local_610 = 0;
  local_600 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_608 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_5f8 = "case0022";
  local_5f0 = case0023;
  local_5e8 = 0;
  local_5d8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_5e0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_5d0 = "case0023";
  local_5c8 = case0024;
  local_5c0 = 0;
  local_5b0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_5b8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_5a8 = "case0024";
  local_5a0 = case0025;
  local_598 = 0;
  local_588 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_590 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_580 = "case0025";
  local_578 = case0026;
  local_570 = 0;
  local_560 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_568 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_558 = "case0026";
  local_550 = case0027;
  local_548 = 0;
  local_538 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_540 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_530 = "case0027";
  local_528 = case0028;
  local_520 = 0;
  local_510 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_518 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_508 = "case0028";
  local_500 = case0029;
  local_4f8 = 0;
  local_4e8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_4f0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_4e0 = "case0029";
  local_4d8 = case0030;
  local_4d0 = 0;
  local_4c0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_4c8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_4b8 = "case0030";
  local_4b0 = case0031;
  local_4a8 = 0;
  local_498 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_4a0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_490 = "case0031";
  local_488 = case0032;
  local_480 = 0;
  local_470 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_478 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_468 = "case0032";
  local_460 = case0033;
  local_458 = 0;
  local_448 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_450 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_440 = "case0033";
  local_438 = case0034;
  local_430 = 0;
  local_420 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_428 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_418 = "case0034";
  local_410 = case0035;
  local_408 = 0;
  local_3f8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_400 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_3f0 = "case0035";
  local_3e8 = case0036;
  local_3e0 = 0;
  local_3d0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_3d8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_3c8 = "case0036";
  local_3c0 = case0037;
  local_3b8 = 0;
  local_3a8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_3b0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_3a0 = "case0037";
  local_398 = case0038;
  local_390 = 0;
  local_380 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_388 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_378 = "case0038";
  local_370 = case0039;
  local_368 = 0;
  local_358 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_360 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_350 = "case0039";
  local_348 = case0040;
  local_340 = 0;
  local_330 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_338 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_328 = "case0040";
  local_320 = case0041;
  local_318 = 0;
  local_308 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_310 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_300 = "case0041";
  local_2f8 = case0042;
  local_2f0 = 0;
  local_2e0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_2e8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_2d8 = "case0042";
  local_2d0 = case0043;
  local_2c8 = 0;
  local_2b8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_2c0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_2b0 = "case0043";
  local_2a8 = case0044;
  local_2a0 = 0;
  local_290 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_298 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_288 = "case0044";
  local_280 = case0045;
  local_278 = 0;
  local_268 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_270 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_260 = "case0045";
  local_258 = case0046;
  local_250 = 0;
  local_240 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_248 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_238 = "case0046";
  local_230 = case0047;
  local_228 = 0;
  local_218 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_220 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_210 = "case0047";
  local_208 = case0048;
  local_200 = 0;
  local_1f0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_1f8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_1e8 = "case0048";
  local_1e0 = case0049;
  local_1d8 = 0;
  local_1c8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_1d0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_1c0 = "case0049";
  local_1b8 = case0050;
  local_1b0 = 0;
  local_1a0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_198 = "case0050";
  local_190 = case0051;
  local_188 = 0;
  local_178 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_180 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_170 = "case0051";
  local_168 = case0052;
  local_160 = 0;
  local_150 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_148 = "case0052";
  local_140 = case0053;
  local_138 = 0;
  local_128 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_130 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_120 = "case0053";
  local_118 = case0054;
  local_110 = 0;
  local_100 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_f8 = "case0054";
  local_f0 = case0055;
  local_e8 = 0;
  local_d8 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_manager;
  local_d0 = "case0055";
  local_c8 = case0056;
  local_c0 = 0;
  local_b0 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_manager;
  local_a8 = "case0056";
  local_a0 = case0057;
  local_98 = 0;
  local_88 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_invoke;
  local_90 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_manager;
  local_80 = "case0057";
  local_78 = case0058;
  local_70 = 0;
  local_60 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_manager;
  local_58 = "case0058";
  local_50 = case0059;
  local_48 = 0;
  local_38 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_manager;
  local_30 = "case0059";
  __l._M_len = 0x3c;
  __l._M_array = (iterator)local_988;
  std::
  vector<std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>_>_>
  ::vector(&this->tests_,__l,&local_989);
  lVar2 = -0x960;
  ppcVar1 = &local_50;
  do {
    if (ppcVar1[2] != (code *)0x0) {
      (*ppcVar1[2])(ppcVar1,ppcVar1,3);
    }
    ppcVar1 = ppcVar1 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  return;
}

Assistant:

TypeCanonicalizerAndResolverTester(TestSuite* suite)
        : Tester(suite)
    {}